

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<CLIArguments::Rename,_8UL>::clear
          (SmallVector<CLIArguments::Rename,_8UL> *this)

{
  ulong local_18;
  size_t i;
  SmallVector<CLIArguments::Rename,_8UL> *this_local;
  
  for (local_18 = 0; local_18 < (this->super_VectorView<CLIArguments::Rename>).buffer_size;
      local_18 = local_18 + 1) {
    CLIArguments::Rename::~Rename((this->super_VectorView<CLIArguments::Rename>).ptr + local_18);
  }
  (this->super_VectorView<CLIArguments::Rename>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}